

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngget.c
# Opt level: O0

png_fixed_point
png_get_pixel_aspect_ratio_fixed(png_const_structrp png_ptr,png_const_inforp info_ptr)

{
  int iVar1;
  png_fixed_point local_24;
  png_const_inforp ppStack_20;
  png_fixed_point res;
  png_const_inforp info_ptr_local;
  png_const_structrp png_ptr_local;
  
  if (((((png_ptr == (png_const_structrp)0x0) || (info_ptr == (png_const_inforp)0x0)) ||
       ((info_ptr->valid & 0x80) == 0)) ||
      ((info_ptr->x_pixels_per_unit == 0 || (info_ptr->y_pixels_per_unit == 0)))) ||
     ((0x7fffffff < info_ptr->x_pixels_per_unit ||
      ((0x7fffffff < info_ptr->y_pixels_per_unit ||
       (ppStack_20 = info_ptr, info_ptr_local = (png_const_inforp)png_ptr,
       iVar1 = png_muldiv(&local_24,info_ptr->y_pixels_per_unit,100000,info_ptr->x_pixels_per_unit),
       iVar1 == 0)))))) {
    png_ptr_local._4_4_ = 0;
  }
  else {
    png_ptr_local._4_4_ = local_24;
  }
  return png_ptr_local._4_4_;
}

Assistant:

png_fixed_point PNGAPI
png_get_pixel_aspect_ratio_fixed(png_const_structrp png_ptr,
    png_const_inforp info_ptr)
{
#ifdef PNG_READ_pHYs_SUPPORTED
   if (png_ptr != NULL && info_ptr != NULL &&
       (info_ptr->valid & PNG_INFO_pHYs) != 0 &&
       info_ptr->x_pixels_per_unit > 0 && info_ptr->y_pixels_per_unit > 0 &&
       info_ptr->x_pixels_per_unit <= PNG_UINT_31_MAX &&
       info_ptr->y_pixels_per_unit <= PNG_UINT_31_MAX)
   {
      png_fixed_point res;

      png_debug1(1, "in %s retrieval function", "png_get_aspect_ratio_fixed");

      /* The following casts work because a PNG 4 byte integer only has a valid
       * range of 0..2^31-1; otherwise the cast might overflow.
       */
      if (png_muldiv(&res, (png_int_32)info_ptr->y_pixels_per_unit, PNG_FP_1,
          (png_int_32)info_ptr->x_pixels_per_unit) != 0)
         return res;
   }
#else
   PNG_UNUSED(png_ptr)
   PNG_UNUSED(info_ptr)
#endif

   return 0;
}